

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O0

string * QPDFSystemError::createWhat
                   (string *__return_storage_ptr__,string *description,int system_errno)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined1 local_1d;
  int local_1c;
  string *psStack_18;
  int system_errno_local;
  string *description_local;
  string *message;
  
  local_1d = 0;
  local_1c = system_errno;
  psStack_18 = description;
  description_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::operator+(&local_60,psStack_18,": ");
  __rhs = strerror(local_1c);
  std::operator+(&local_40,&local_60,__rhs);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFSystemError::createWhat(std::string const& description, int system_errno)
{
    std::string message;
#ifdef _MSC_VER
    // "94" is mentioned in the MSVC docs, but it's still safe if the
    // message is longer.  strerror_s is a templated function that
    // knows the size of buf and truncates.
    char buf[94];
    if (strerror_s(buf, system_errno) != 0) {
        message = description + ": failed with an unknown error";
    } else {
        message = description + ": " + buf;
    }
#else
    message = description + ": " + strerror(system_errno);
#endif
    return message;
}